

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O2

void __thiscall
ON_Triangle::Split(ON_Triangle *this,uchar edge,ON_3dPoint pt,ON_Triangle *out_a,ON_Triangle *out_b)

{
  ON_3dPoint *pOVar1;
  double dVar2;
  
  out_a->m_V[0].z = this->m_V[0].z;
  dVar2 = this->m_V[0].y;
  out_a->m_V[0].x = this->m_V[0].x;
  out_a->m_V[0].y = dVar2;
  pOVar1 = out_a->m_V + 2;
  if (edge % 3 == 1) {
    out_a->m_V[1].z = this->m_V[1].z;
    dVar2 = this->m_V[1].y;
    out_a->m_V[1].x = this->m_V[1].x;
    out_a->m_V[1].y = dVar2;
    out_a->m_V[2].z = pt.z;
    pOVar1->x = pt.x;
    out_a->m_V[2].y = pt.y;
    out_b->m_V[0].z = pt.z;
    out_b->m_V[0].x = pt.x;
    out_b->m_V[0].y = pt.y;
    dVar2 = this->m_V[1].y;
    out_b->m_V[1].x = this->m_V[1].x;
    out_b->m_V[1].y = dVar2;
    pt.z = this->m_V[1].z;
  }
  else {
    if (edge % 3 != 0) {
      out_a->m_V[1].z = pt.z;
      out_a->m_V[1].x = pt.x;
      out_a->m_V[1].y = pt.y;
      out_a->m_V[2].z = this->m_V[2].z;
      dVar2 = this->m_V[2].y;
      pOVar1->x = this->m_V[2].x;
      out_a->m_V[2].y = dVar2;
      out_b->m_V[0].z = pt.z;
      out_b->m_V[0].x = pt.x;
      out_b->m_V[0].y = pt.y;
      dVar2 = this->m_V[1].y;
      out_b->m_V[1].x = this->m_V[1].x;
      out_b->m_V[1].y = dVar2;
      out_b->m_V[1].z = this->m_V[1].z;
      goto LAB_004e3a0d;
    }
    out_a->m_V[1].z = this->m_V[1].z;
    dVar2 = this->m_V[1].y;
    out_a->m_V[1].x = this->m_V[1].x;
    out_a->m_V[1].y = dVar2;
    out_a->m_V[2].z = pt.z;
    pOVar1->x = pt.x;
    out_a->m_V[2].y = pt.y;
    out_b->m_V[0].z = this->m_V[0].z;
    dVar2 = this->m_V[0].y;
    out_b->m_V[0].x = this->m_V[0].x;
    out_b->m_V[0].y = dVar2;
    out_b->m_V[1].x = pt.x;
    out_b->m_V[1].y = pt.y;
  }
  out_b->m_V[1].z = pt.z;
LAB_004e3a0d:
  out_b->m_V[2].z = this->m_V[2].z;
  dVar2 = this->m_V[2].y;
  out_b->m_V[2].x = this->m_V[2].x;
  out_b->m_V[2].y = dVar2;
  return;
}

Assistant:

void ON_Triangle::Split(unsigned char edge, ON_3dPoint pt, ON_Triangle& out_a, ON_Triangle& out_b) const
{
  switch (edge % 3)
  {
  case 0:
    out_a.m_V[0] = m_V[0];
    out_a.m_V[1] = m_V[1];
    out_a.m_V[2] = pt;
    out_b.m_V[0] = m_V[0];
    out_b.m_V[1] = pt;
    out_b.m_V[2] = m_V[2];
    break;
  case 1:
    out_a.m_V[0] = m_V[0];
    out_a.m_V[1] = m_V[1];
    out_a.m_V[2] = pt;
    out_b.m_V[0] = pt;
    out_b.m_V[1] = m_V[1];
    out_b.m_V[2] = m_V[2];
    break;
  default: //2
    out_a.m_V[0] = m_V[0];
    out_a.m_V[1] = pt;
    out_a.m_V[2] = m_V[2];
    out_b.m_V[0] = pt;
    out_b.m_V[1] = m_V[1];
    out_b.m_V[2] = m_V[2];
    break;
  }
}